

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall Utf8Decode_ImpossibleBytes_Test::TestBody(Utf8Decode_ImpossibleBytes_Test *this)

{
  bytes *input;
  bytes *input_00;
  bytes *input_01;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  allocator_type local_85;
  uchar local_84 [4];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  cpstring local_68;
  cpstring local_48;
  cpstring local_28;
  
  local_84[0] = 0xfe;
  __l._M_len = 1;
  __l._M_array = local_84;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,__l,&local_85);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_28,&local_80,input);
  std::__cxx11::u32string::~u32string((u32string *)&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  local_84[0] = 0xff;
  __l_00._M_len = 1;
  __l_00._M_array = local_84;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,__l_00,&local_85);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_48,&local_80,input_00);
  std::__cxx11::u32string::~u32string((u32string *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  local_84[0] = 0xfe;
  local_84[1] = 0xfe;
  local_84[2] = 0xff;
  local_84[3] = 0xff;
  __l_01._M_len = 4;
  __l_01._M_array = local_84;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,__l_01,&local_85);
  (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_68,&local_80,input_01);
  std::__cxx11::u32string::~u32string((u32string *)&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  return;
}

Assistant:

TEST_F (Utf8Decode, ImpossibleBytes) {
    decode_bad (bytes ({0xFE}));
    decode_bad (bytes ({0xFF}));
    decode_bad (bytes ({0xFE, 0xFE, 0xFF, 0xFF}));
}